

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.hpp
# Opt level: O2

InterfaceVariableInfo *
glu::getProgramInterfaceVariableInfo
          (InterfaceVariableInfo *__return_storage_ptr__,Functions *gl,deUint32 program,
          deUint32 programInterface,deUint32 index)

{
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->index = 0xffffffff;
  __return_storage_ptr__->blockIndex = 0xffffffff;
  __return_storage_ptr__->atomicCounterBufferIndex = 0xffffffff;
  __return_storage_ptr__->type = 0;
  __return_storage_ptr__->arraySize = 0;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->arrayStride = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->arrayStride + 1) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->topLevelArraySize + 1) = 0;
  getProgramInterfaceVariableInfo(gl,program,programInterface,index,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline InterfaceVariableInfo getProgramInterfaceVariableInfo (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index)
{
	InterfaceVariableInfo info;
	getProgramInterfaceVariableInfo(gl, program, programInterface, index, info);
	return info;
}